

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.h
# Opt level: O3

void __thiscall cmGeneratorTarget::ImportInfo::ImportInfo(ImportInfo *this,ImportInfo *param_1)

{
  pointer pcVar1;
  undefined3 uVar2;
  uint uVar3;
  
  uVar2 = *(undefined3 *)&param_1->field_0x1;
  uVar3 = param_1->Multiplicity;
  this->NoSOName = param_1->NoSOName;
  *(undefined3 *)&this->field_0x1 = uVar2;
  this->Multiplicity = uVar3;
  (this->Location)._M_dataplus._M_p = (pointer)&(this->Location).field_2;
  pcVar1 = (param_1->Location)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Location,pcVar1,pcVar1 + (param_1->Location)._M_string_length);
  (this->SOName)._M_dataplus._M_p = (pointer)&(this->SOName).field_2;
  pcVar1 = (param_1->SOName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->SOName,pcVar1,pcVar1 + (param_1->SOName)._M_string_length);
  (this->ImportLibrary)._M_dataplus._M_p = (pointer)&(this->ImportLibrary).field_2;
  pcVar1 = (param_1->ImportLibrary)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ImportLibrary,pcVar1,
             pcVar1 + (param_1->ImportLibrary)._M_string_length);
  (this->LibName)._M_dataplus._M_p = (pointer)&(this->LibName).field_2;
  pcVar1 = (param_1->LibName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->LibName,pcVar1,pcVar1 + (param_1->LibName)._M_string_length);
  (this->Languages)._M_dataplus._M_p = (pointer)&(this->Languages).field_2;
  pcVar1 = (param_1->Languages)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Languages,pcVar1,pcVar1 + (param_1->Languages)._M_string_length);
  (this->Libraries)._M_dataplus._M_p = (pointer)&(this->Libraries).field_2;
  pcVar1 = (param_1->Libraries)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Libraries,pcVar1,pcVar1 + (param_1->Libraries)._M_string_length);
  (this->LibrariesProp)._M_dataplus._M_p = (pointer)&(this->LibrariesProp).field_2;
  pcVar1 = (param_1->LibrariesProp)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->LibrariesProp,pcVar1,
             pcVar1 + (param_1->LibrariesProp)._M_string_length);
  (this->SharedDeps)._M_dataplus._M_p = (pointer)&(this->SharedDeps).field_2;
  pcVar1 = (param_1->SharedDeps)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->SharedDeps,pcVar1,pcVar1 + (param_1->SharedDeps)._M_string_length);
  return;
}

Assistant:

ImportInfo()
      : NoSOName(false)
      , Multiplicity(0)
    {
    }